

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O3

Bool tidyOptCopyConfig(TidyDoc to,TidyDoc from)

{
  TidyDocImpl *docFrom;
  TidyDocImpl *docTo;
  
  if (from != (TidyDoc)0x0 && to != (TidyDoc)0x0) {
    prvTidyCopyConfig((TidyDocImpl *)to,(TidyDocImpl *)from);
  }
  return (uint)(from != (TidyDoc)0x0 && to != (TidyDoc)0x0);
}

Assistant:

Bool TIDY_CALL tidyOptCopyConfig( TidyDoc to, TidyDoc from )
{
    TidyDocImpl* docTo = tidyDocToImpl( to );
    TidyDocImpl* docFrom = tidyDocToImpl( from );
    if ( docTo && docFrom )
    {
        TY_(CopyConfig)( docTo, docFrom );
        return yes;
    }
    return no;
}